

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O1

string * __thiscall
google::protobuf::compiler::python::Generator::
ModuleLevelDescriptorName<google::protobuf::Descriptor>
          (string *__return_storage_ptr__,Generator *this,Descriptor *descriptor)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  size_type sVar3;
  pointer pcVar4;
  long *plVar5;
  long *plVar6;
  size_type *psVar7;
  size_type sVar8;
  string local_88;
  long *local_68;
  long local_60;
  long local_58;
  long lStack_50;
  string local_48;
  
  paVar1 = &local_88.field_2;
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"_","");
  anon_unknown_0::NamePrefixedWithNestedTypes<google::protobuf::Descriptor>
            (__return_storage_ptr__,descriptor,&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  sVar3 = __return_storage_ptr__->_M_string_length;
  if (sVar3 != 0) {
    pcVar4 = (__return_storage_ptr__->_M_dataplus)._M_p;
    sVar8 = 0;
    do {
      cVar2 = pcVar4[sVar8];
      if ((byte)(cVar2 + 0x9fU) < 0x1a) {
        pcVar4[sVar8] = cVar2 + -0x20;
      }
      sVar8 = sVar8 + 1;
    } while (sVar3 != sVar8);
  }
  std::operator+(&local_88,"_",__return_storage_ptr__);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  if (*(FileDescriptor **)(descriptor + 0x10) != this->file_) {
    anon_unknown_0::ModuleAlias(&local_48,*(string **)*(FileDescriptor **)(descriptor + 0x10));
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_48);
    plVar6 = plVar5 + 2;
    if ((long *)*plVar5 == plVar6) {
      local_58 = *plVar6;
      lStack_50 = plVar5[3];
      local_68 = &local_58;
    }
    else {
      local_58 = *plVar6;
      local_68 = (long *)*plVar5;
    }
    local_60 = plVar5[1];
    *plVar5 = (long)plVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_68,(ulong)(__return_storage_ptr__->_M_dataplus)._M_p)
    ;
    psVar7 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_88.field_2._M_allocated_capacity = *psVar7;
      local_88.field_2._8_8_ = plVar5[3];
      local_88._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_88.field_2._M_allocated_capacity = *psVar7;
      local_88._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_88._M_string_length = plVar5[1];
    *plVar5 = (long)psVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != paVar1) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    if (local_68 != &local_58) {
      operator_delete(local_68,local_58 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string Generator::ModuleLevelDescriptorName(
    const DescriptorT& descriptor) const {
  // FIXME(robinson):
  // We currently don't worry about collisions with underscores in the type
  // names, so these would collide in nasty ways if found in the same file:
  //   OuterProto.ProtoA.ProtoB
  //   OuterProto_ProtoA.ProtoB  # Underscore instead of period.
  // As would these:
  //   OuterProto.ProtoA_.ProtoB
  //   OuterProto.ProtoA._ProtoB  # Leading vs. trailing underscore.
  // (Contrived, but certainly possible).
  //
  // The C++ implementation doesn't guard against this either.  Leaving
  // it for now...
  string name = NamePrefixedWithNestedTypes(descriptor, "_");
  UpperString(&name);
  // Module-private for now.  Easy to make public later; almost impossible
  // to make private later.
  name = "_" + name;
  // We now have the name relative to its own module.  Also qualify with
  // the module name iff this descriptor is from a different .proto file.
  if (descriptor.file() != file_) {
    name = ModuleAlias(descriptor.file()->name()) + "." + name;
  }
  return name;
}